

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O1

UBool __thiscall
icu_63::CollationFastLatinBuilder::encodeCharCEs
          (CollationFastLatinBuilder *this,UErrorCode *errorCode)

{
  short sVar1;
  long first;
  int iVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  UnicodeString *this_00;
  long lVar5;
  int iVar6;
  int32_t iVar7;
  UChar local_46;
  UChar local_44;
  UChar local_42;
  UnicodeString *local_40;
  UErrorCode *local_38;
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    sVar1 = (this->result).fUnion.fStackFields.fLengthAndFlags;
    iVar2 = (this->result).fUnion.fFields.fLength;
    iVar6 = 0x1c0;
    local_38 = errorCode;
    do {
      local_46 = L'\0';
      UnicodeString::doAppend(&this->result,&local_46,0,1);
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
    iVar6 = (int)(short)((uint)(int)sVar1 >> 5);
    if (sVar1 < 0) {
      iVar6 = iVar2;
    }
    sVar1 = (this->result).fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar2 = (this->result).fUnion.fFields.fLength;
    }
    else {
      iVar2 = (int)sVar1 >> 5;
    }
    lVar5 = 0x20;
    local_40 = &this->result;
    do {
      first = *(long *)((long)(this->charCEs + -2) + lVar5);
      if (first == 0x101000100 || (int)((ulong)first >> 0x20) != 1) {
        uVar3 = encodeTwoCEs(this,first,*(int64_t *)((long)(this->charCEs + -2) + 8 + lVar5));
        uVar4 = uVar3;
        if (0xffff < uVar3) {
          sVar1 = (this->result).fUnion.fStackFields.fLengthAndFlags;
          if (sVar1 < 0) {
            iVar7 = (this->result).fUnion.fFields.fLength;
          }
          else {
            iVar7 = (int)sVar1 >> 5;
          }
          uVar4 = 1;
          if (iVar7 - iVar2 < 0x400) {
            local_44 = (UChar)(uVar3 >> 0x10);
            this_00 = UnicodeString::doAppend(local_40,&local_44,0,1);
            local_42 = (UChar)uVar3;
            UnicodeString::doAppend(this_00,&local_42,0,1);
            uVar4 = iVar7 - iVar2 | 0x800;
          }
        }
        UnicodeString::setCharAt(local_40,iVar6,(UChar)uVar4);
      }
      iVar6 = iVar6 + 1;
      lVar5 = lVar5 + 0x10;
    } while (lVar5 != 0x1c20);
    return *local_38 < U_ILLEGAL_ARGUMENT_ERROR;
  }
  return '\0';
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }